

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_1::GraphicsPipeline::initPrograms(SourceCollections *dst)

{
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [40];
  undefined1 local_38 [40];
  
  std::__cxx11::string::string<std::allocator<char>>(local_80,"vert",&local_81);
  local_38._0_4_ = VK_SHADER_STAGE_VERTEX_BIT;
  std::__cxx11::string::string((string *)(local_38 + 8),local_80);
  ShaderModule::initPrograms(dst,(Parameters *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"frag",&local_81);
  local_60._0_4_ = VK_SHADER_STAGE_FRAGMENT_BIT;
  std::__cxx11::string::string((string *)(local_60 + 8),local_80);
  ShaderModule::initPrograms(dst,(Parameters *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 8));
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

static void initPrograms (SourceCollections& dst, Parameters)
	{
		ShaderModule::initPrograms(dst, ShaderModule::Parameters(VK_SHADER_STAGE_VERTEX_BIT, "vert"));
		ShaderModule::initPrograms(dst, ShaderModule::Parameters(VK_SHADER_STAGE_FRAGMENT_BIT, "frag"));
	}